

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqBroker.cpp
# Opt level: O2

bool __thiscall helics::zeromq::ZmqBroker::brokerConnect(ZmqBroker *this)

{
  bool bVar1;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  ZmqContextManager::startContext(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  bVar1 = NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1>::
          brokerConnect(&this->
                         super_NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1>
                       );
  return bVar1;
}

Assistant:

bool ZmqBroker::brokerConnect()
    {
        ZmqContextManager::startContext();
        return NetworkBroker::brokerConnect();
    }